

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O3

void RigidBodyDynamics::ForwardDynamicsApplyConstraintForces
               (Model *model,VectorNd *Tau,ConstraintSet *CS,VectorNd *QDDot)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  JointType JVar14;
  uint uVar15;
  pointer pJVar16;
  pointer pSVar17;
  pointer pMVar18;
  pointer pVVar19;
  pointer pSVar20;
  double *pdVar21;
  CustomJoint *pCVar22;
  pointer pSVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  ulong uVar71;
  long lVar72;
  pointer pSVar73;
  double *pdVar74;
  long lVar75;
  ulong uVar76;
  pointer pMVar77;
  uint uVar78;
  pointer pMVar79;
  double dVar80;
  pointer pSVar81;
  SpatialTransform *pSVar82;
  Index othersize;
  ulong uVar83;
  ulong rows;
  Index othersize_1;
  double dVar84;
  Index dstRows_1;
  byte bVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  VectorNd tau_temp;
  SpatialTransform X_lambda;
  SpatialVector pa;
  Vector3d qdd_temp;
  SpatialMatrix Ia;
  double dStack_5c0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_598;
  undefined1 local_588 [24];
  VectorNd *local_570;
  VectorNd *local_568;
  ulong local_560;
  SpatialMatrix local_558;
  double local_418;
  double dStack_410;
  double local_408;
  double dStack_400;
  double local_3f8;
  double dStack_3f0;
  double local_3e8;
  double dStack_3e0;
  double local_3d8;
  double dStack_3d0;
  SpatialVector local_3c8;
  SpatialMatrix local_398;
  SpatialMatrix_t local_278;
  SpatialMatrix local_158;
  
  bVar85 = 0;
  uVar71 = ((long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  local_570 = QDDot;
  local_568 = Tau;
  if (1 < uVar71) {
    uVar83 = 1;
    uVar78 = 2;
    do {
      Math::SpatialRigidBodyInertia::toMatrix
                ((model->I).
                 super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar83);
      memcpy((model->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
             super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>._M_impl
             .super__Vector_impl_data._M_start + uVar83,&local_558,0x120);
      pSVar73 = (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar75 = uVar83 * 0x30;
      Math::SpatialRigidBodyInertia::operator*
                ((model->I).
                 super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar83,pSVar73 + uVar83);
      dVar80 = *(double *)
                ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      dVar84 = *(double *)
                &pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
      dVar3 = *(double *)
               ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
      dVar4 = *(double *)
               ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28);
      dVar5 = *(double *)
               ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      dVar6 = *(double *)
               ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
      pSVar73 = (model->pA).
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      *(double *)
       &pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
           local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] *
           dVar5 + -dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[4] +
                   -dVar80 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array[1] +
                   dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[2];
      *(double *)
       ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
           local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] *
           -dVar6 + dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[3] +
                    dVar80 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array[0] +
                    -dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[2];
      pdVar74 = (double *)
                ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      *pdVar74 = local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [4] * dVar6 +
                 ((local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[1] * dVar84 -
                  dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0]) -
                 dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[3]);
      pdVar74[1] = local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[4] * -dVar80 +
                   dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[5];
      pdVar74 = (double *)
                ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      *pdVar74 = local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [3] * dVar80 +
                 -dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[5];
      pdVar74[1] = local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[3] * -dVar3 +
                   dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[4];
      dVar80 = *(double *)(*(long *)(CS + 0x550) + lVar75);
      if ((dVar80 != 0.0) || (NAN(dVar80))) {
LAB_0013da49:
        Math::SpatialTransform::toMatrixAdjoint
                  (&local_558,
                   (model->X_base).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar83);
        lVar72 = *(long *)(CS + 0x550);
        pSVar73 = (model->pA).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar84 = *(double *)(lVar72 + lVar75);
        dVar3 = *(double *)(lVar72 + 8 + lVar75);
        dVar4 = *(double *)(lVar72 + 0x10 + lVar75);
        dVar5 = *(double *)(lVar72 + 0x18 + lVar75);
        pdVar74 = (double *)(lVar72 + 0x20 + lVar75);
        dVar6 = *pdVar74;
        dVar13 = pdVar74[1];
        dVar80 = *(double *)
                  ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) -
                 (local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[0x1f] * dVar13 +
                 local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [0x19] * dVar6 +
                 local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [0x13] * dVar5 +
                 local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [0xd] * dVar4 +
                 local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [7] * dVar3 +
                 local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [1] * dVar84);
        auVar24._8_4_ = SUB84(dVar80,0);
        auVar24._0_8_ =
             *(double *)
              &pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> -
             (local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
              [0x1e] * dVar13 +
             local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             [0x18] * dVar6 +
             local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             [0x12] * dVar5 +
             local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             [0xc] * dVar4 +
             local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6]
             * dVar3 + local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0] * dVar84);
        auVar24._12_4_ = (int)((ulong)dVar80 >> 0x20);
        *(undefined1 (*) [16])
         &pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar24;
        pdVar74 = (double *)
                  ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar80 = pdVar74[1] -
                 (local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[0x21] * dVar13 +
                 local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [0x1b] * dVar6 +
                 local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [0x15] * dVar5 +
                 local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [0xf] * dVar4 +
                 local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [9] * dVar3 +
                 local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [3] * dVar84);
        pdVar21 = (double *)
                  ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar37 = *pdVar21;
        dVar38 = pdVar21[1];
        auVar25._8_4_ = SUB84(dVar80,0);
        auVar25._0_8_ =
             *pdVar74 -
             (local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
              [0x20] * dVar13 +
             local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             [0x1a] * dVar6 +
             local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             [0x14] * dVar5 +
             local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             [0xe] * dVar4 +
             local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8]
             * dVar3 + local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[2] * dVar84);
        auVar25._12_4_ = (int)((ulong)dVar80 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar25;
        pdVar74 = (double *)
                  ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *pdVar74 = dVar37 - (dVar13 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                      m_storage.m_data.array[0x22] +
                            dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[0x1c] +
                            dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[0x16] +
                            dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[0x10] +
                            dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[10] +
                            dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                     m_storage.m_data.array[4]);
        pdVar74[1] = dVar38 - (dVar13 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>
                                        .m_storage.m_data.array[0x23] +
                              dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                      m_storage.m_data.array[0x1d] +
                              dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                      m_storage.m_data.array[0x17] +
                              dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                      m_storage.m_data.array[0x11] +
                              dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                      m_storage.m_data.array[0xb] +
                              dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                       m_storage.m_data.array[5]);
      }
      else {
        lVar72 = *(long *)(CS + 0x550) + lVar75;
        if (((*(double *)(lVar72 + 8) != 0.0) ||
            ((((NAN(*(double *)(lVar72 + 8)) || (*(double *)(lVar72 + 0x10) != 0.0)) ||
              (NAN(*(double *)(lVar72 + 0x10)))) ||
             ((*(double *)(lVar72 + 0x18) != 0.0 || (NAN(*(double *)(lVar72 + 0x18)))))))) ||
           ((*(double *)(lVar72 + 0x20) != 0.0 ||
            (((NAN(*(double *)(lVar72 + 0x20)) || (*(double *)(lVar72 + 0x28) != 0.0)) ||
             (NAN(*(double *)(lVar72 + 0x28)))))))) goto LAB_0013da49;
      }
      uVar83 = (ulong)uVar78;
      uVar71 = ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      uVar78 = uVar78 + 1;
    } while (uVar83 <= uVar71 && uVar71 - uVar83 != 0);
  }
  uVar78 = (int)uVar71 - 1;
  if (uVar78 != 0) {
    uVar71 = (ulong)uVar78;
    do {
      pJVar16 = (model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar78 = pJVar16[uVar71].q_index;
      JVar14 = pJVar16[uVar71].mJointType;
      if (pJVar16[uVar71].mDoFCount == 1) {
        if (JVar14 == JointTypeCustom) goto LAB_0013ee9c;
        pSVar73 = (model->S).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar17 = (model->pA).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar74 = (double *)
                  ((long)&pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar21 = (double *)
                  ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar1 = (double *)
                 ((long)&pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        pdVar2 = (double *)
                 ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        (model->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
        [uVar71] = (local_568->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data[uVar78] -
                   (pdVar1[1] * pdVar2[1] + pdVar74[1] * pdVar21[1] +
                    *(double *)
                     ((long)&pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
                    *(double *)
                     ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) +
                   *pdVar1 * *pdVar2 + *pdVar74 * *pdVar21 +
                   *(double *)
                    &pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
                   *(double *)
                    &pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>);
        uVar83 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar71];
        if (uVar83 != 0) {
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               (double)((model->IA).
                        super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                        super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar71);
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               (double)((model->U).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar71);
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
               (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[uVar71];
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
               local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [1];
          SpatialMatrix_t::
          SpatialMatrix_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>,0>const>>
                    (&local_278,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>,_0>_>_>
                      *)&local_558);
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               (double)((model->pA).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar71);
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
               (double)((model->c).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar71);
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
               (double)((model->U).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar71);
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] =
               (model->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[uVar71];
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] =
               (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[uVar71];
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
               (double)&local_278;
          SpatialVector_t::
          SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>>
                    (&local_3c8,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>_>
                      *)&local_558);
          Math::SpatialTransform::toMatrixTranspose
                    (&local_398,
                     (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar71);
          Math::SpatialTransform::toMatrix
                    (&local_158,
                     (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar71);
          dVar55 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x23];
          dVar54 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x22];
          dVar53 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x21];
          dVar52 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x20];
          dVar51 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1f];
          dVar50 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1e];
          dVar49 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1d];
          dVar48 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1c];
          dVar47 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1b];
          dVar46 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1a];
          dVar45 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x19];
          dVar44 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x18];
          dVar43 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x17];
          dVar42 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x16];
          dVar41 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x13];
          dVar40 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x12];
          dVar39 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x11];
          dVar38 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x10];
          dVar37 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0xd];
          dVar13 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0xc];
          dVar6 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[0xb];
          dVar5 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[10];
          dVar4 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[3];
          dVar3 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[2];
          dVar84 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[1];
          dVar80 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0];
          pSVar20 = (model->IA).
                    super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                    super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_3d8 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[4];
          dStack_3d0 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[5];
          local_3e8 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[6];
          dStack_3e0 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[7];
          local_3f8 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[8];
          dStack_3f0 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[9];
          local_408 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[0xe];
          dStack_400 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0xf];
          local_418 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[0x14];
          dStack_410 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x15];
          lVar75 = 0;
          do {
            dVar7 = *(double *)
                     ((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75);
            dVar8 = *(double *)
                     ((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 8);
            dVar9 = *(double *)
                     ((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x10);
            dVar10 = *(double *)
                      ((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 0x18);
            dVar86 = dStack_3e0 * dVar8;
            dVar11 = *(double *)
                      ((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 0x20);
            dVar12 = *(double *)
                      ((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 0x28);
            *(double *)
             ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar75) =
                 dVar50 * dVar12 +
                 dVar44 * dVar11 +
                 dVar40 * dVar10 + dVar13 * dVar9 + local_3e8 * dVar8 + dVar80 * dVar7;
            *(double *)
             ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar75 + 8) =
                 dVar51 * dVar12 +
                 dVar45 * dVar11 + dVar41 * dVar10 + dVar37 * dVar9 + dVar86 + dVar84 * dVar7;
            dVar87 = dStack_3f0 * dVar8;
            dVar86 = dStack_400 * dVar9;
            dVar88 = dStack_410 * dVar10;
            *(double *)
             ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar75 + 0x10) =
                 dVar52 * dVar12 +
                 dVar46 * dVar11 +
                 local_418 * dVar10 + local_408 * dVar9 + local_3f8 * dVar8 + dVar3 * dVar7;
            *(double *)
             ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar75 + 0x18) =
                 dVar53 * dVar12 + dVar47 * dVar11 + dVar88 + dVar86 + dVar87 + dVar4 * dVar7;
            dVar86 = dVar7 * dStack_3d0;
            *(double *)
             ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar75 + 0x20) =
                 dVar12 * dVar54 +
                 dVar11 * dVar48 +
                 dVar10 * dVar42 + dVar9 * dVar38 + dVar8 * dVar5 + dVar7 * local_3d8;
            *(double *)
             ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar75 + 0x28) =
                 dVar12 * dVar55 +
                 dVar11 * dVar49 + dVar10 * dVar43 + dVar9 * dVar39 + dVar8 * dVar6 + dVar86;
            lVar75 = lVar75 + 0x30;
          } while (lVar75 != 0x120);
          lVar75 = 0;
          do {
            dVar80 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75);
            dVar84 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 8);
            dVar3 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x10);
            dVar4 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x18);
            dVar5 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x20);
            dVar6 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x28);
            pdVar74 = (double *)
                      ((long)&pSVar20[uVar83].super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + lVar75)
            ;
            dVar13 = pdVar74[1];
            pdVar21 = (double *)
                      ((long)&pSVar20[uVar83].super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + lVar75)
            ;
            *pdVar21 = dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array[0x1e] +
                       dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array[0x18] +
                       dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array[0x12] +
                       dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array[0xc] +
                       dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[6] +
                       dVar80 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0] + *pdVar74;
            pdVar21[1] = dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x1f] +
                         dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x19] +
                         dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x13] +
                         dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0xd] +
                         dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                  m_storage.m_data.array[7] +
                         dVar80 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                  m_storage.m_data.array[1] + dVar13;
            dVar80 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75);
            dVar84 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 8);
            dVar3 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x10);
            dVar4 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x18);
            dVar5 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x20);
            dVar6 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x28);
            pdVar74 = (double *)
                      ((long)&pSVar20[uVar83].super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                      lVar75 + 0x10);
            dVar13 = pdVar74[1];
            pdVar21 = (double *)
                      ((long)&pSVar20[uVar83].super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                      lVar75 + 0x10);
            *pdVar21 = dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array[0x20] +
                       dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array[0x1a] +
                       dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array[0x14] +
                       dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array[0xe] +
                       dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[8] +
                       dVar80 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[2] + *pdVar74;
            pdVar21[1] = dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x21] +
                         dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x1b] +
                         dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x15] +
                         dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0xf] +
                         dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                  m_storage.m_data.array[9] +
                         dVar80 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                  m_storage.m_data.array[3] + dVar13;
            dVar80 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75);
            dVar84 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 8);
            dVar3 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x10);
            dVar4 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x18);
            dVar5 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x20);
            dVar6 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x28);
            pdVar74 = (double *)
                      ((long)&pSVar20[uVar83].super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                      lVar75 + 0x20);
            dVar13 = pdVar74[1];
            pdVar21 = (double *)
                      ((long)&pSVar20[uVar83].super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                      lVar75 + 0x20);
            *pdVar21 = dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array[0x22] +
                       dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array[0x1c] +
                       dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array[0x16] +
                       dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array[0x10] +
                       dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[10] +
                       dVar80 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[4] + *pdVar74;
            pdVar21[1] = dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x23] +
                         dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x1d] +
                         dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x17] +
                         dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x11] +
                         dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                  m_storage.m_data.array[0xb] +
                         dVar80 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                  m_storage.m_data.array[5] + dVar13;
            lVar75 = lVar75 + 0x30;
          } while (lVar75 != 0x120);
          Math::SpatialTransform::applyTranspose
                    ((model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar71,&local_3c8);
          pSVar73 = (model->pA).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
LAB_0013ee45:
          dVar80 = local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[1] +
                   *(double *)
                    ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
          auVar27._8_4_ = SUB84(dVar80,0);
          auVar27._0_8_ =
               local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0] + *(double *)
                      &pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
          auVar27._12_4_ = (int)((ulong)dVar80 >> 0x20);
          *(undefined1 (*) [16])
           &pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar27;
          pdVar74 = (double *)
                    ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          dVar80 = local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[3] + pdVar74[1];
          auVar28._8_4_ = SUB84(dVar80,0);
          auVar28._0_8_ =
               local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [2] + *pdVar74;
          auVar28._12_4_ = (int)((ulong)dVar80 >> 0x20);
          *(undefined1 (*) [16])
           ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar28;
          pdVar74 = (double *)
                    ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar80 = local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[5] + pdVar74[1];
          auVar29._8_4_ = SUB84(dVar80,0);
          auVar29._0_8_ =
               local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [4] + *pdVar74;
          auVar29._12_4_ = (int)((ulong)dVar80 >> 0x20);
          *(undefined1 (*) [16])
           ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar29;
        }
      }
      else if (pJVar16[uVar71].mDoFCount == 3) {
        if (JVar14 == JointTypeCustom) {
LAB_0013ee9c:
          uVar15 = pJVar16[uVar71].custom_joint_index;
          rows = (ulong)*(uint *)((model->mCustomJoints).
                                  super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar15] + 8);
          local_560 = (ulong)(model->lambda).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar71];
          local_598.m_storage.m_data = (double *)0x0;
          local_598.m_storage.m_rows = 0;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_598,rows,1)
          ;
          uVar83 = rows;
          if (local_598.m_storage.m_rows != rows) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_598,rows,1);
            uVar83 = local_598.m_storage.m_rows;
          }
          pdVar74 = local_598.m_storage.m_data;
          if (0 < (long)uVar83) {
            memset(local_598.m_storage.m_data,0,uVar83 * 8);
          }
          if (rows != 0) {
            pdVar21 = (local_568->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            uVar76 = 0;
            do {
              pdVar74[uVar76] = pdVar21[uVar78 + (int)uVar76];
              uVar76 = uVar76 + 1;
            } while (rows != uVar76);
          }
          pCVar22 = (model->mCustomJoints).
                    super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar15];
          pSVar73 = (model->pA).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar71;
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               0.0;
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               0.0;
          if (uVar83 != 0) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_558,uVar83
                       ,1);
            pMVar79 = (pointer)((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                      m_storage.m_data.array[1] -
                                ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                       m_storage.m_data.array[1] >> 0x3f) & 0xfffffffffffffffe);
            if (1 < (long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[1]) {
              lVar75 = 0;
              do {
                dVar80 = (pdVar74 + lVar75)[1];
                pdVar21 = (((Matrix<double,_6,_6,_0,_6,_6> *)
                           local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[0])->
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.
                          m_data.array + lVar75;
                *pdVar21 = pdVar74[lVar75];
                pdVar21[1] = dVar80;
                lVar75 = lVar75 + 2;
              } while (lVar75 < (long)pMVar79);
            }
            if ((long)pMVar79 <
                (long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[1]) {
              do {
                (((Matrix<double,_6,_6,_0,_6,_6> *)
                 local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [0])->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.
                m_data.array[(long)pMVar79] = pdVar74[(long)pMVar79];
                pMVar79 = (pointer)((long)&(pMVar79->
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                                           ).m_storage + 1);
              } while ((pointer)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[1] != pMVar79);
            }
          }
          dVar80 = local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0];
          if (0 < (long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[1]) {
            lVar75 = *(long *)(pCVar22 + 0x78);
            pdVar74 = (double *)(*(long *)(pCVar22 + 0x70) + 0x20);
            pMVar79 = (pointer)0x0;
            do {
              (((Matrix<double,_6,_6,_0,_6,_6> *)
               local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0])->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.m_data.
              array[(long)pMVar79] =
                   (((Matrix<double,_6,_6,_0,_6,_6> *)
                    local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[0])->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).
                   m_storage.m_data.array[(long)pMVar79] -
                   (*(double *)
                     ((long)&(pSVar73->super_Matrix<double,_6,_1,_0,_6,_1>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) *
                    pdVar74[1] +
                    *(double *)
                     ((long)&(pSVar73->super_Matrix<double,_6,_1,_0,_6,_1>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) *
                    pdVar74[-1] +
                    *(double *)
                     ((long)&(pSVar73->super_Matrix<double,_6,_1,_0,_6,_1>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
                    pdVar74[-3] +
                   *(double *)
                    ((long)&(pSVar73->super_Matrix<double,_6,_1,_0,_6,_1>).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) *
                   *pdVar74 +
                   *(double *)
                    ((long)&(pSVar73->super_Matrix<double,_6,_1,_0,_6,_1>).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) *
                   pdVar74[-2] +
                   *(double *)
                    &(pSVar73->super_Matrix<double,_6,_1,_0,_6,_1>).
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> * pdVar74[-4]);
              pMVar79 = (pointer)((long)&(pMVar79->
                                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                                         ).m_storage + 1);
              pdVar74 = pdVar74 + lVar75;
            } while ((pointer)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[1] != pMVar79);
          }
          pMVar79 = (pointer)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array[1];
          if (*(pointer *)(pCVar22 + 0xc0) !=
              (pointer)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[1]) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(pCVar22 + 0xb8),
                       (Index)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[1],1);
            pMVar79 = *(pointer *)(pCVar22 + 0xc0);
          }
          pdVar74 = ((DenseStorage<double,__1,__1,_1,_0> *)&pCVar22[0xb8].field_0x0)->m_data;
          pMVar77 = (pointer)((long)pMVar79 - ((long)pMVar79 >> 0x3f) & 0xfffffffffffffffe);
          if (1 < (long)pMVar79) {
            lVar75 = 0;
            do {
              pdVar21 = (((Matrix<double,_6,_6,_0,_6,_6> *)dVar80)->
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.
                        m_data.array + lVar75;
              dVar84 = pdVar21[1];
              pdVar1 = pdVar74 + lVar75;
              *pdVar1 = *pdVar21;
              pdVar1[1] = dVar84;
              lVar75 = lVar75 + 2;
            } while (lVar75 < (long)pMVar77);
          }
          if ((long)pMVar77 < (long)pMVar79) {
            do {
              pdVar74[(long)pMVar77] =
                   (((Matrix<double,_6,_6,_0,_6,_6> *)dVar80)->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.m_data.
                   array[(long)pMVar77];
              pMVar77 = (pointer)((long)&(pMVar77->
                                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                                         ).m_storage + 1);
            } while (pMVar79 != pMVar77);
          }
          free((void *)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0]);
          uVar83 = local_560;
          if (local_560 != 0) {
            local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
                 (double)((model->IA).
                          super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                          super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar71);
            local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
                 (double)(model->mCustomJoints).
                         super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar15];
            local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
                 (double)((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[2] + 0x88);
            local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
                 (double)((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[2] + 0xa0);
            local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
                 local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [1];
            SpatialMatrix_t::
            SpatialMatrix_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const>>
                      (&local_278,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>_>
                        *)&local_558);
            local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
                 (double)((model->pA).
                          super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar71);
            local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
                 (double)((model->c).
                          super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar71);
            local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] =
                 (double)(model->mCustomJoints).
                         super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar15];
            local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] =
                 (double)((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[7] + 0x88);
            local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
                 (double)((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[7] + 0xa0);
            local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] =
                 (double)((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[7] + 0xb8);
            local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
                 (double)&local_278;
            SpatialVector_t::
            SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>const>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
                      (&local_3c8,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                        *)&local_558);
            Math::SpatialTransform::toMatrixTranspose
                      (&local_398,
                       (model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar71);
            Math::SpatialTransform::toMatrix
                      (&local_158,
                       (model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar71);
            dVar55 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x23];
            dVar54 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x22];
            dVar53 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x21];
            dVar52 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x20];
            dVar51 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1f];
            dVar50 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1e];
            dVar49 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1d];
            dVar48 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1c];
            dVar47 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1b];
            dVar46 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1a];
            dVar45 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x19];
            dVar44 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x18];
            dVar43 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x17];
            dVar42 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x16];
            dVar41 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x13];
            dVar40 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x12];
            dVar39 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x11];
            dVar38 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x10];
            dVar37 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xd];
            dVar13 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xc];
            dVar6 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[0xb];
            dVar5 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[10];
            dVar4 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[3];
            dVar3 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[2];
            dVar84 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[1];
            dVar80 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0];
            pSVar20 = (model->IA).
                      super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                      super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_3d8 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[4];
            dStack_3d0 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[5];
            local_3e8 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[6];
            dStack_3e0 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[7];
            local_3f8 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[8];
            dStack_3f0 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[9];
            local_408 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0xe];
            dStack_400 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[0xf];
            local_418 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x14];
            dStack_410 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[0x15];
            lVar75 = 0;
            do {
              dVar7 = *(double *)
                       ((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75);
              dVar8 = *(double *)
                       ((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 8);
              dVar9 = *(double *)
                       ((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x10);
              dVar10 = *(double *)
                        ((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar75 + 0x18);
              dVar86 = dStack_3e0 * dVar8;
              dVar11 = *(double *)
                        ((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar75 + 0x20);
              dVar12 = *(double *)
                        ((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar75 + 0x28);
              *(double *)
               ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array + lVar75) =
                   dVar50 * dVar12 +
                   dVar44 * dVar11 +
                   dVar40 * dVar10 + dVar13 * dVar9 + local_3e8 * dVar8 + dVar80 * dVar7;
              *(double *)
               ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array + lVar75 + 8) =
                   dVar51 * dVar12 +
                   dVar45 * dVar11 + dVar41 * dVar10 + dVar37 * dVar9 + dVar86 + dVar84 * dVar7;
              dVar87 = dStack_3f0 * dVar8;
              dVar86 = dStack_400 * dVar9;
              dVar88 = dStack_410 * dVar10;
              *(double *)
               ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array + lVar75 + 0x10) =
                   dVar52 * dVar12 +
                   dVar46 * dVar11 +
                   local_418 * dVar10 + local_408 * dVar9 + local_3f8 * dVar8 + dVar3 * dVar7;
              *(double *)
               ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array + lVar75 + 0x18) =
                   dVar53 * dVar12 + dVar47 * dVar11 + dVar88 + dVar86 + dVar87 + dVar4 * dVar7;
              dVar86 = dVar7 * dStack_3d0;
              *(double *)
               ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array + lVar75 + 0x20) =
                   dVar12 * dVar54 +
                   dVar11 * dVar48 +
                   dVar10 * dVar42 + dVar9 * dVar38 + dVar8 * dVar5 + dVar7 * local_3d8;
              *(double *)
               ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array + lVar75 + 0x28) =
                   dVar12 * dVar55 +
                   dVar11 * dVar49 + dVar10 * dVar43 + dVar9 * dVar39 + dVar8 * dVar6 + dVar86;
              lVar75 = lVar75 + 0x30;
            } while (lVar75 != 0x120);
            lVar75 = 0;
            do {
              dVar80 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar75);
              dVar84 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar75 + 8);
              dVar3 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x10);
              dVar4 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x18);
              dVar5 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x20);
              dVar6 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x28);
              pdVar74 = (double *)
                        ((long)&pSVar20[uVar83].super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                        lVar75);
              dVar13 = pdVar74[1];
              pdVar21 = (double *)
                        ((long)&pSVar20[uVar83].super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                        lVar75);
              *pdVar21 = dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x1e] +
                         dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x18] +
                         dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x12] +
                         dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0xc] +
                         dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                  m_storage.m_data.array[6] +
                         dVar80 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                  m_storage.m_data.array[0] + *pdVar74;
              pdVar21[1] = dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x1f] +
                           dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x19] +
                           dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x13] +
                           dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0xd] +
                           dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[7] +
                           dVar80 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[1] + dVar13;
              dVar80 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar75);
              dVar84 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar75 + 8);
              dVar3 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x10);
              dVar4 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x18);
              dVar5 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x20);
              dVar6 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x28);
              pdVar74 = (double *)
                        ((long)&pSVar20[uVar83].super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                        lVar75 + 0x10);
              dVar13 = pdVar74[1];
              pdVar21 = (double *)
                        ((long)&pSVar20[uVar83].super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                        lVar75 + 0x10);
              *pdVar21 = dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x20] +
                         dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x1a] +
                         dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x14] +
                         dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0xe] +
                         dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                  m_storage.m_data.array[8] +
                         dVar80 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                  m_storage.m_data.array[2] + *pdVar74;
              pdVar21[1] = dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x21] +
                           dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x1b] +
                           dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x15] +
                           dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0xf] +
                           dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[9] +
                           dVar80 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[3] + dVar13;
              dVar80 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar75);
              dVar84 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar75 + 8);
              dVar3 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x10);
              dVar4 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x18);
              dVar5 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x20);
              dVar6 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x28);
              pdVar74 = (double *)
                        ((long)&pSVar20[uVar83].super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                        lVar75 + 0x20);
              dVar13 = pdVar74[1];
              pdVar21 = (double *)
                        ((long)&pSVar20[uVar83].super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                        lVar75 + 0x20);
              *pdVar21 = dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x22] +
                         dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x1c] +
                         dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x16] +
                         dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x10] +
                         dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                  m_storage.m_data.array[10] +
                         dVar80 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                  m_storage.m_data.array[4] + *pdVar74;
              pdVar21[1] = dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x23] +
                           dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x1d] +
                           dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x17] +
                           dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x11] +
                           dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[0xb] +
                           dVar80 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[5] + dVar13;
              lVar75 = lVar75 + 0x30;
            } while (lVar75 != 0x120);
            Math::SpatialTransform::applyTranspose
                      ((model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar71,&local_3c8);
            pSVar73 = (model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            dVar80 = local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[1] +
                     *(double *)
                      ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
            auVar34._8_4_ = SUB84(dVar80,0);
            auVar34._0_8_ =
                 local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [0] + *(double *)
                        &pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
            auVar34._12_4_ = (int)((ulong)dVar80 >> 0x20);
            *(undefined1 (*) [16])
             &pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar34;
            pdVar74 = (double *)
                      ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
            dVar80 = local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[3] + pdVar74[1];
            auVar35._8_4_ = SUB84(dVar80,0);
            auVar35._0_8_ =
                 local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [2] + *pdVar74;
            auVar35._12_4_ = (int)((ulong)dVar80 >> 0x20);
            *(undefined1 (*) [16])
             ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar35;
            pdVar74 = (double *)
                      ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
            dVar80 = local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[5] + pdVar74[1];
            auVar36._8_4_ = SUB84(dVar80,0);
            auVar36._0_8_ =
                 local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [4] + *pdVar74;
            auVar36._12_4_ = (int)((ulong)dVar80 >> 0x20);
            *(undefined1 (*) [16])
             ((long)&pSVar73[uVar83].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar36;
          }
          free(local_598.m_storage.m_data);
        }
        else {
          uVar83 = (ulong)(model->lambda).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar71];
          pdVar74 = (local_568->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               pdVar74[uVar78];
          local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               pdVar74[uVar78 + 1];
          local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
               pdVar74[uVar78 + 2];
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               (double)((model->multdof3_S).
                        super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        .
                        super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar71);
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
               (double)((model->pA).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar71);
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               (double)&local_278;
          Vector3_t::operator=
                    ((model->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar71,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>_>
                      *)&local_558);
          if (uVar83 != 0) {
            local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
                 (double)((model->IA).
                          super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                          super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar71);
            local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
                 (double)((model->multdof3_U).
                          super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                          .
                          super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar71);
            local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
                 (double)((model->multdof3_Dinv).
                          super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar71);
            local_560 = uVar83;
            local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
                 local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [1];
            SpatialMatrix_t::
            SpatialMatrix_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,0>const>>
                      (&local_278,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_0>_>_>
                        *)&local_558);
            pSVar73 = (model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pSVar17 = (model->c).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pMVar79 = (model->multdof3_U).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pMVar18 = (model->multdof3_Dinv).
                      super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pVVar19 = (model->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pdVar74 = (double *)
                      ((long)&pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
            pdVar21 = (double *)
                      ((long)&pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
            dVar4 = *(double *)
                     &pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
            dVar5 = *(double *)
                     ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
            dVar6 = *(double *)
                     ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
            dVar13 = *(double *)
                      ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
            pdVar1 = (double *)
                     ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
            dVar37 = *pdVar1;
            dVar38 = pdVar1[1];
            dVar39 = *(double *)
                      &pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
            dVar40 = *(double *)
                      ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
            dVar41 = *(double *)
                      ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
            dVar42 = *(double *)
                      ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
            pdVar1 = (double *)
                     ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
            dVar43 = *pdVar1;
            dVar44 = pdVar1[1];
            dVar45 = *(double *)
                      &pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
            dVar46 = *(double *)
                      ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
            dVar47 = *(double *)
                      ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
            dVar48 = *(double *)
                      ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
            pdVar1 = (double *)
                     ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
            dVar49 = *pdVar1;
            dVar50 = pdVar1[1];
            dVar51 = *(double *)
                      &pMVar18[uVar71].super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage;
            dVar52 = *(double *)
                      ((long)&pMVar18[uVar71].super_Matrix3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                      + 8);
            dVar53 = *(double *)
                      ((long)&pMVar18[uVar71].super_Matrix3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                      + 0x10);
            dVar54 = *(double *)
                      &pMVar79[uVar71].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                       m_storage;
            dVar55 = *(double *)
                      ((long)&pMVar79[uVar71].
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
                      + 8);
            pdVar1 = (double *)
                     ((long)&pMVar79[uVar71].
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
                     + 0x10);
            dVar7 = *pdVar1;
            dVar8 = pdVar1[1];
            pdVar1 = (double *)
                     ((long)&pMVar79[uVar71].
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
                     + 0x20);
            dVar9 = *pdVar1;
            dVar10 = pdVar1[1];
            pdVar1 = (double *)
                     ((long)&pMVar79[uVar71].
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
                     + 0x30);
            dVar11 = *pdVar1;
            dVar12 = pdVar1[1];
            pdVar1 = (double *)
                     ((long)&pMVar79[uVar71].
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
                     + 0x60);
            dVar86 = *pdVar1;
            dVar87 = pdVar1[1];
            dVar80 = dVar86 * dVar53 + dVar11 * dVar52 + dVar54 * dVar51;
            dVar84 = dVar87 * dVar53 + dVar12 * dVar52 + dVar55 * dVar51;
            local_588._8_4_ = SUB84(dVar84,0);
            local_588._0_8_ = dVar80;
            local_588._12_4_ = (int)((ulong)dVar84 >> 0x20);
            pdVar1 = (double *)
                     ((long)&pMVar79[uVar71].
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
                     + 0x40);
            dVar88 = *pdVar1;
            dVar56 = pdVar1[1];
            pdVar1 = (double *)
                     ((long)&pMVar79[uVar71].
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
                     + 0x70);
            dVar57 = *pdVar1;
            dVar58 = pdVar1[1];
            dVar84 = dVar53 * dVar57 + dVar52 * dVar88 + dVar51 * dVar7;
            dVar3 = dVar53 * dVar58 + dVar52 * dVar56 + dVar51 * dVar8;
            auVar26._8_4_ = SUB84(dVar3,0);
            auVar26._0_8_ = dVar84;
            auVar26._12_4_ = (int)((ulong)dVar3 >> 0x20);
            pdVar1 = (double *)
                     ((long)&pMVar79[uVar71].
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
                     + 0x50);
            dVar3 = *pdVar1;
            dVar59 = pdVar1[1];
            pdVar1 = (double *)
                     ((long)&pMVar79[uVar71].
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
                     + 0x80);
            dVar60 = *pdVar1;
            dVar61 = pdVar1[1];
            dVar62 = *(double *)
                      ((long)&pMVar18[uVar71].super_Matrix3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                      + 0x18);
            dVar63 = *(double *)
                      ((long)&pMVar18[uVar71].super_Matrix3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                      + 0x20);
            dVar64 = *(double *)
                      ((long)&pMVar18[uVar71].super_Matrix3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                      + 0x28);
            dVar65 = *(double *)
                      ((long)&pMVar18[uVar71].super_Matrix3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                      + 0x30);
            pdVar1 = (double *)
                     ((long)&pMVar18[uVar71].super_Matrix3d.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                     + 0x38);
            dVar66 = *pdVar1;
            dVar67 = pdVar1[1];
            dVar68 = *(double *)
                      &pVVar19[uVar71].super_Vector3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage;
            pdVar1 = (double *)
                     ((long)&pVVar19[uVar71].super_Vector3d.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     + 8);
            dVar69 = *pdVar1;
            dVar70 = pdVar1[1];
            local_3c8.super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
                 dVar70 * (dVar86 * dVar67 + dVar11 * dVar66 + dVar54 * dVar65) +
                 dVar69 * (dVar86 * dVar64 + dVar11 * dVar63 + dVar54 * dVar62) + dVar68 * dVar80 +
                 dVar38 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x1e] +
                 dVar37 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x18] +
                 dVar13 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x12] +
                 dVar6 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[0xc] +
                 dVar5 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[6] +
                 dVar4 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[0] +
                 *(double *)
                  &pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
            local_3c8.super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
                 dVar70 * (dVar87 * dVar67 + dVar12 * dVar66 + dVar55 * dVar65) +
                 dVar69 * (dVar87 * dVar64 + dVar12 * dVar63 + dVar55 * dVar62) +
                 dVar68 * (double)local_588._8_8_ +
                 dVar38 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x1f] +
                 dVar37 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x19] +
                 dVar13 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x13] +
                 dVar6 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[0xd] +
                 dVar5 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[7] +
                 dVar4 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[1] +
                 *(double *)
                  ((long)&pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
            dVar80 = *(double *)
                      &pVVar19[uVar71].super_Vector3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage;
            pdVar1 = (double *)
                     ((long)&pVVar19[uVar71].super_Vector3d.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     + 8);
            dVar4 = *pdVar1;
            dVar5 = pdVar1[1];
            dStack_5c0 = auVar26._8_8_;
            local_3c8.super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
                 dVar5 * (dVar57 * dVar67 + dVar88 * dVar66 + dVar7 * dVar65) +
                 dVar4 * (dVar57 * dVar64 + dVar88 * dVar63 + dVar7 * dVar62) + dVar80 * dVar84 +
                 dVar44 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x20] +
                 dVar43 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x1a] +
                 dVar42 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x14] +
                 dVar41 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0xe] +
                 dVar40 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[8] +
                 dVar39 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[2] + *pdVar74;
            local_3c8.super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
                 dVar5 * (dVar58 * dVar67 + dVar56 * dVar66 + dVar8 * dVar65) +
                 dVar4 * (dVar58 * dVar64 + dVar56 * dVar63 + dVar8 * dVar62) + dVar80 * dStack_5c0
                 + dVar44 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[0x21] +
                   dVar43 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[0x1b] +
                   dVar42 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[0x15] +
                   dVar41 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[0xf] +
                   dVar40 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[9] +
                   dVar39 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[3] + pdVar74[1];
            dVar80 = *(double *)
                      &pVVar19[uVar71].super_Vector3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage;
            pdVar74 = (double *)
                      ((long)&pVVar19[uVar71].super_Vector3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                      + 8);
            dVar84 = *pdVar74;
            dVar4 = pdVar74[1];
            local_3c8.super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
                 dVar4 * (dVar67 * dVar60 + dVar66 * dVar3 + dVar65 * dVar9) +
                 dVar84 * (dVar64 * dVar60 + dVar63 * dVar3 + dVar62 * dVar9) +
                 dVar80 * (dVar53 * dVar60 + dVar52 * dVar3 + dVar51 * dVar9) +
                 dVar50 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x22] +
                 dVar49 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x1c] +
                 dVar48 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x16] +
                 dVar47 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x10] +
                 dVar46 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[10] +
                 dVar45 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[4] + *pdVar21;
            local_3c8.super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
                 dVar4 * (dVar67 * dVar61 + dVar66 * dVar59 + dVar65 * dVar10) +
                 dVar84 * (dVar64 * dVar61 + dVar63 * dVar59 + dVar62 * dVar10) +
                 dVar80 * (dVar53 * dVar61 + dVar52 * dVar59 + dVar51 * dVar10) +
                 dVar50 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x23] +
                 dVar49 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x1d] +
                 dVar48 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x17] +
                 dVar47 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x11] +
                 dVar46 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0xb] +
                 dVar45 * local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[5] + pdVar21[1];
            Math::SpatialTransform::toMatrixTranspose
                      (&local_398,
                       (model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar71);
            Math::SpatialTransform::toMatrix
                      (&local_158,
                       (model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar71);
            dVar55 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x23];
            dVar54 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x22];
            dVar53 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x21];
            dVar52 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x20];
            dVar51 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1f];
            dVar50 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1e];
            dVar49 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1d];
            dVar48 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1c];
            dVar47 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1b];
            dVar46 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1a];
            dVar45 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x19];
            dVar44 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x18];
            dVar43 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x17];
            dVar42 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x16];
            dVar41 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x13];
            dVar40 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x12];
            dVar39 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x11];
            dVar38 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x10];
            dVar37 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xd];
            dVar13 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xc];
            dVar6 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[0xb];
            dVar5 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[10];
            dVar4 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[3];
            dVar3 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[2];
            dVar84 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[1];
            dVar80 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0];
            uVar83 = local_560;
            pSVar20 = (model->IA).
                      super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                      super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_3d8 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[4];
            dStack_3d0 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[5];
            local_3e8 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[6];
            dStack_3e0 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[7];
            local_3f8 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[8];
            dStack_3f0 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[9];
            local_408 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0xe];
            dStack_400 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[0xf];
            local_418 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x14];
            dStack_410 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[0x15];
            lVar75 = 0;
            do {
              dVar7 = *(double *)
                       ((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75);
              dVar8 = *(double *)
                       ((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 8);
              dVar9 = *(double *)
                       ((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x10);
              dVar10 = *(double *)
                        ((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar75 + 0x18);
              dVar86 = dStack_3e0 * dVar8;
              dVar11 = *(double *)
                        ((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar75 + 0x20);
              dVar12 = *(double *)
                        ((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar75 + 0x28);
              *(double *)
               ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array + lVar75) =
                   dVar50 * dVar12 +
                   dVar44 * dVar11 +
                   dVar40 * dVar10 + dVar13 * dVar9 + local_3e8 * dVar8 + dVar80 * dVar7;
              *(double *)
               ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array + lVar75 + 8) =
                   dVar51 * dVar12 +
                   dVar45 * dVar11 + dVar41 * dVar10 + dVar37 * dVar9 + dVar86 + dVar84 * dVar7;
              dVar87 = dStack_3f0 * dVar8;
              dVar86 = dStack_400 * dVar9;
              dVar88 = dStack_410 * dVar10;
              *(double *)
               ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array + lVar75 + 0x10) =
                   dVar52 * dVar12 +
                   dVar46 * dVar11 +
                   local_418 * dVar10 + local_408 * dVar9 + local_3f8 * dVar8 + dVar3 * dVar7;
              *(double *)
               ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array + lVar75 + 0x18) =
                   dVar53 * dVar12 + dVar47 * dVar11 + dVar88 + dVar86 + dVar87 + dVar4 * dVar7;
              dVar86 = dVar7 * dStack_3d0;
              *(double *)
               ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array + lVar75 + 0x20) =
                   dVar12 * dVar54 +
                   dVar11 * dVar48 +
                   dVar10 * dVar42 + dVar9 * dVar38 + dVar8 * dVar5 + dVar7 * local_3d8;
              *(double *)
               ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array + lVar75 + 0x28) =
                   dVar12 * dVar55 +
                   dVar11 * dVar49 + dVar10 * dVar43 + dVar9 * dVar39 + dVar8 * dVar6 + dVar86;
              lVar75 = lVar75 + 0x30;
            } while (lVar75 != 0x120);
            lVar75 = 0;
            do {
              dVar80 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar75);
              dVar84 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar75 + 8);
              dVar3 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x10);
              dVar4 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x18);
              dVar5 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x20);
              dVar6 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x28);
              pdVar74 = (double *)
                        ((long)&pSVar20[local_560].super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                        lVar75);
              dVar13 = pdVar74[1];
              pdVar21 = (double *)
                        ((long)&pSVar20[local_560].super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                        lVar75);
              *pdVar21 = dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x1e] +
                         dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x18] +
                         dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x12] +
                         dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0xc] +
                         dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                  m_storage.m_data.array[6] +
                         dVar80 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                  m_storage.m_data.array[0] + *pdVar74;
              pdVar21[1] = dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x1f] +
                           dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x19] +
                           dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x13] +
                           dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0xd] +
                           dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[7] +
                           dVar80 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[1] + dVar13;
              dVar80 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar75);
              dVar84 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar75 + 8);
              dVar3 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x10);
              dVar4 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x18);
              dVar5 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x20);
              dVar6 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x28);
              pdVar74 = (double *)
                        ((long)&pSVar20[local_560].super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                        lVar75 + 0x10);
              dVar13 = pdVar74[1];
              pdVar21 = (double *)
                        ((long)&pSVar20[local_560].super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                        lVar75 + 0x10);
              *pdVar21 = dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x20] +
                         dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x1a] +
                         dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x14] +
                         dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0xe] +
                         dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                  m_storage.m_data.array[8] +
                         dVar80 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                  m_storage.m_data.array[2] + *pdVar74;
              pdVar21[1] = dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x21] +
                           dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x1b] +
                           dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x15] +
                           dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0xf] +
                           dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[9] +
                           dVar80 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[3] + dVar13;
              dVar80 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar75);
              dVar84 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar75 + 8);
              dVar3 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x10);
              dVar4 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x18);
              dVar5 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x20);
              dVar6 = *(double *)
                       ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array + lVar75 + 0x28);
              pdVar74 = (double *)
                        ((long)&pSVar20[local_560].super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                        lVar75 + 0x20);
              dVar13 = pdVar74[1];
              pdVar21 = (double *)
                        ((long)&pSVar20[local_560].super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                        lVar75 + 0x20);
              *pdVar21 = dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x22] +
                         dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x1c] +
                         dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x16] +
                         dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x10] +
                         dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                  m_storage.m_data.array[10] +
                         dVar80 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                  m_storage.m_data.array[4] + *pdVar74;
              pdVar21[1] = dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x23] +
                           dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x1d] +
                           dVar4 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x17] +
                           dVar3 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x11] +
                           dVar84 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[0xb] +
                           dVar80 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[5] + dVar13;
              lVar75 = lVar75 + 0x30;
            } while (lVar75 != 0x120);
            Math::SpatialTransform::applyTranspose
                      ((model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar71,&local_3c8);
            pSVar73 = (model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_0013ee45;
          }
        }
      }
      else if (JVar14 == JointTypeCustom) goto LAB_0013ee9c;
      uVar71 = uVar71 - 1;
    } while ((int)uVar71 != 0);
  }
  dVar80 = (model->gravity).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  pSVar73 = (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
            super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  dVar84 = (model->gravity).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  dVar3 = (model->gravity).super_Vector3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  *(undefined8 *)
   &(pSVar73->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
  *(double *)
   ((long)&(pSVar73->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
  *(double *)
   ((long)&(pSVar73->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = 0.0;
  *(double *)
   ((long)&(pSVar73->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) = -dVar84;
  *(double *)
   ((long)&(pSVar73->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = -dVar3;
  *(double *)
   ((long)&(pSVar73->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = -dVar80;
  if (1 < (ulong)(((long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7)) {
    uVar71 = 1;
    do {
      uVar78 = (model->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar71].q_index;
      uVar15 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar71];
      pSVar23 = (model->X_lambda).
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                .
                super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar81 = pSVar23 + uVar71;
      pSVar82 = (SpatialTransform *)&local_558;
      for (lVar75 = 9; lVar75 != 0; lVar75 = lVar75 + -1) {
        (pSVar82->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[0] = *(double *)&(pSVar81->E).super_Matrix3d;
        pSVar81 = (pointer)((long)pSVar81 + ((ulong)bVar85 * -2 + 1) * 8);
        pSVar82 = (SpatialTransform *)((long)pSVar82 + (ulong)bVar85 * -0x10 + 8);
      }
      local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] =
           *(double *)((long)&pSVar23[uVar71].r.super_Vector3d + 0x10);
      local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] =
           *(double *)
            &pSVar23[uVar71].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
      local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10] =
           *(double *)
            ((long)&pSVar23[uVar71].r.super_Vector3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8);
      Math::SpatialTransform::apply
                ((SpatialTransform *)&local_558,
                 (model->a).
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar15);
      pSVar73 = (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar17 = (model->c).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      dVar80 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [1] + *(double *)
                      ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
      auVar30._8_4_ = SUB84(dVar80,0);
      auVar30._0_8_ =
           local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] +
           *(double *)
            &pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
      auVar30._12_4_ = (int)((ulong)dVar80 >> 0x20);
      *(undefined1 (*) [16])
       &pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar30;
      pdVar74 = (double *)
                ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      dVar80 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [3] + pdVar74[1];
      auVar31._8_4_ = SUB84(dVar80,0);
      auVar31._0_8_ =
           local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] +
           *pdVar74;
      auVar31._12_4_ = (int)((ulong)dVar80 >> 0x20);
      *(undefined1 (*) [16])
       ((long)&pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar31;
      pdVar74 = (double *)
                ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      dVar80 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [5] + pdVar74[1];
      auVar32._8_4_ = SUB84(dVar80,0);
      auVar32._0_8_ =
           local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] +
           *pdVar74;
      auVar32._12_4_ = (int)((ulong)dVar80 >> 0x20);
      *(undefined1 (*) [16])
       ((long)&pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar32;
      pJVar16 = (model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      JVar14 = pJVar16[uVar71].mJointType;
      if (pJVar16[uVar71].mDoFCount == 1) {
        if (JVar14 == JointTypeCustom) goto LAB_0013fae2;
        pSVar73 = (model->a).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar17 = (model->U).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar74 = (double *)
                  ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar21 = (double *)
                  ((long)&pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar1 = (double *)
                 ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        pdVar2 = (double *)
                 ((long)&pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar84 = ((model->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data[uVar71] -
                 (pdVar1[1] * pdVar2[1] + pdVar74[1] * pdVar21[1] +
                  *(double *)
                   ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
                  *(double *)
                   ((long)&pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) +
                 *pdVar1 * *pdVar2 + *pdVar74 * *pdVar21 +
                 *(double *)
                  &pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
                 *(double *)
                  &pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>)) *
                 (1.0 / (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data[uVar71]);
        (local_570->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
        [uVar78] = dVar84;
        pSVar17 = (model->S).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar3 = *(double *)
                 ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        dVar80 = *(double *)
                  ((long)&pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        *(double *)
         &pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
             *(double *)
              &pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> * dVar84 +
             *(double *)
              &pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
        *(double *)
         ((long)&pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
             dVar3 * dVar84 + dVar80;
        pdVar74 = (double *)
                  ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar3 = pdVar74[1];
        pdVar21 = (double *)
                  ((long)&pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar80 = pdVar21[1];
        pdVar1 = (double *)
                 ((long)&pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar1 = *pdVar74 * dVar84 + *pdVar21;
        pdVar1[1] = dVar3 * dVar84 + dVar80;
        pdVar74 = (double *)
                  ((long)&pSVar17[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        pdVar21 = (double *)
                  ((long)&pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar80 = dVar84 * pdVar74[1] + pdVar21[1];
        auVar33._8_4_ = SUB84(dVar80,0);
        auVar33._0_8_ = dVar84 * *pdVar74 + *pdVar21;
        auVar33._12_4_ = (int)((ulong)dVar80 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar73[uVar71].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar33;
      }
      else if (pJVar16[uVar71].mDoFCount == 3) {
        if (JVar14 == JointTypeCustom) {
LAB_0013fae2:
          uVar15 = pJVar16[uVar71].custom_joint_index;
          dVar84 = (double)(ulong)*(uint *)((model->mCustomJoints).
                                            super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar15] + 8);
          local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               0.0;
          local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               0.0;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_398,
                     (Index)dVar84,1);
          dVar80 = dVar84;
          if (local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]
              != dVar84) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_398,
                       (Index)dVar84,1);
            dVar80 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[1];
          }
          if (0 < (long)dVar80) {
            memset((void *)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[0],0,(long)dVar80 << 3);
          }
          local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
               (double)(model->mCustomJoints).
                       super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar15];
          local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               (double)((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[2] + 0xa0);
          local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               (double)((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[2] + 0xb8);
          local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
               (double)((long)local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[2] + 0x88);
          local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
               (double)((model->a).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar71);
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,_1,_0,__1,_1> *)&local_398,
                     (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>
                      *)&local_278,(assign_op<double,_double> *)&local_158,(type)0x0);
          if (dVar84 != 0.0) {
            pdVar74 = (local_570->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            dVar80 = 0.0;
            do {
              pdVar74[uVar78 + SUB84(dVar80,0)] =
                   *(double *)
                    ((long)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[0] + (long)dVar80 * 8);
              dVar80 = (double)((long)dVar80 + 1);
            } while (dVar84 != dVar80);
          }
          local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               (double)((model->a).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar71);
          local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               (double)((model->mCustomJoints).
                        super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar15] + 0x70);
          local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
               (double)&local_398;
          SpatialVector_t::operator=
                    ((SpatialVector_t *)
                     local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0],(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                               *)&local_278);
          free((void *)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0]);
        }
        else {
          local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               (double)((model->multdof3_Dinv).
                        super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar71);
          local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               (double)((model->multdof3_u).
                        super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar71);
          local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
               (double)((model->multdof3_U).
                        super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        .
                        super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar71);
          local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
               (double)((model->a).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar71);
          Vector3_t::
          Vector3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                    ((Vector3_t *)&local_398,
                     (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                      *)&local_278);
          pdVar74 = (local_570->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          pdVar74[uVar78] =
               local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0];
          pdVar74[uVar78 + 1] =
               local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [1];
          pdVar74[uVar78 + 2] =
               local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [2];
          local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               (double)((model->a).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar71);
          local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               (double)((model->multdof3_S).
                        super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        .
                        super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar71);
          local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
               (double)&local_398;
          SpatialVector_t::operator=
                    ((SpatialVector_t *)
                     local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0],(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                               *)&local_278);
        }
      }
      else if (JVar14 == JointTypeCustom) goto LAB_0013fae2;
      uVar71 = (ulong)((int)uVar71 + 1);
      uVar83 = ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
    } while (uVar71 <= uVar83 && uVar83 - uVar71 != 0);
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsApplyConstraintForces (
  Model &model,
  const VectorNd &Tau,
  ConstraintSet &CS,
  VectorNd &QDDot
)
{
  LOG << "-------- " << __func__ << " --------" << std::endl;
  assert (QDDot.size() == model.dof_count);

  unsigned int i = 0;

  for (i = 1; i < model.mBodies.size(); i++) {
    model.IA[i] = model.I[i].toMatrix();;
    model.pA[i] = crossf(model.v[i],model.I[i] * model.v[i]);

#ifdef RBDL_USE_CASADI_MATH
    {
#else
    if (CS.f_ext_constraints[i] != SpatialVector::Zero()) {
#endif
      LOG << "External force (" << i << ") = "
          << model.X_base[i].toMatrixAdjoint() * CS.f_ext_constraints[i]
          << std::endl;
      model.pA[i] -= model.X_base[i].toMatrixAdjoint()*CS.f_ext_constraints[i];
    }
  }

  // ClearLogOutput();

  LOG << "--- first loop ---" << std::endl;

  for (i = model.mBodies.size() - 1; i > 0; i--) {
    unsigned int q_index = model.mJoints[i].q_index;

    if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      unsigned int lambda = model.lambda[i];
      model.multdof3_u[i] = Vector3d (Tau[q_index],
                                      Tau[q_index + 1],
                                      Tau[q_index + 2])
                            - model.multdof3_S[i].transpose() * model.pA[i];

      if (lambda != 0) {
        SpatialMatrix Ia = model.IA[i] - (model.multdof3_U[i]
                                          * model.multdof3_Dinv[i]
                                          * model.multdof3_U[i].transpose());

        SpatialVector pa = model.pA[i] + Ia * model.c[i]
                           + model.multdof3_U[i] * model.multdof3_Dinv[i] * model.multdof3_u[i];

#ifdef RBDL_USE_CASADI_MATH
        model.IA[lambda] += (model.X_lambda[i].toMatrixTranspose()
                                       * Ia * model.X_lambda[i].toMatrix());
        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.IA[lambda].noalias() += (model.X_lambda[i].toMatrixTranspose()
                                       * Ia * model.X_lambda[i].toMatrix());
        model.pA[lambda].noalias() += model.X_lambda[i].applyTranspose(pa);
#endif

        LOG << "pA[" << lambda << "] = " << model.pA[lambda].transpose()
            << std::endl;
      }
    } else if (model.mJoints[i].mDoFCount == 1
               && model.mJoints[i].mJointType != JointTypeCustom) {
      model.u[i] = Tau[q_index] - model.S[i].dot(model.pA[i]);

      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        SpatialMatrix Ia = model.IA[i]
                           - model.U[i] * (model.U[i] / model.d[i]).transpose();
        SpatialVector pa =  model.pA[i] + Ia * model.c[i]
                            + model.U[i] * model.u[i] / model.d[i];
#ifdef RBDL_USE_CASADI_MATH
        model.IA[lambda] += (model.X_lambda[i].toMatrixTranspose()
                                       * Ia * model.X_lambda[i].toMatrix());
        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.IA[lambda].noalias() += (model.X_lambda[i].toMatrixTranspose()
                                       * Ia * model.X_lambda[i].toMatrix());
        model.pA[lambda].noalias() += model.X_lambda[i].applyTranspose(pa);
#endif

        LOG << "pA[" << lambda << "] = "
            << model.pA[lambda].transpose() << std::endl;
      }
    } else if(model.mJoints[i].mJointType == JointTypeCustom) {

      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      unsigned int lambda = model.lambda[i];
      VectorNd tau_temp = VectorNd::Zero(dofI);

      for(int z=0; z<dofI; ++z) {
        tau_temp[z] = Tau[q_index+z];
      }

      model.mCustomJoints[kI]->u = tau_temp
                                   - (model.mCustomJoints[kI]->S.transpose()
                                      * model.pA[i]);

      if (lambda != 0) {
        SpatialMatrix Ia = model.IA[i]
                           - (   model.mCustomJoints[kI]->U
                                 * model.mCustomJoints[kI]->Dinv
                                 * model.mCustomJoints[kI]->U.transpose());

        SpatialVector pa = model.pA[i] + Ia * model.c[i]
                           + ( model.mCustomJoints[kI]->U
                               * model.mCustomJoints[kI]->Dinv
                               * model.mCustomJoints[kI]->u );

#ifdef RBDL_USE_CASADI_MATH
        model.IA[lambda] += model.X_lambda[i].toMatrixTranspose()
                                      * Ia * model.X_lambda[i].toMatrix();

        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.IA[lambda].noalias() += model.X_lambda[i].toMatrixTranspose()
                                      * Ia * model.X_lambda[i].toMatrix();

        model.pA[lambda].noalias() += model.X_lambda[i].applyTranspose(pa);
#endif

        LOG << "pA[" << lambda << "] = " << model.pA[lambda].transpose()
            << std::endl;
      }
    }
  }

  model.a[0] = SpatialVector (0., 0., 0.,
                              -model.gravity[0],
                              -model.gravity[1],
                              -model.gravity[2]);

  for (i = 1; i < model.mBodies.size(); i++) {
    unsigned int q_index = model.mJoints[i].q_index;
    unsigned int lambda = model.lambda[i];
    SpatialTransform X_lambda = model.X_lambda[i];

    model.a[i] = X_lambda.apply(model.a[lambda]) + model.c[i];
    LOG << "a'[" << i << "] = " << model.a[i].transpose() << std::endl;

    if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      Vector3d qdd_temp = model.multdof3_Dinv[i] *
                          (model.multdof3_u[i]
                           - model.multdof3_U[i].transpose() * model.a[i]);

      QDDot[q_index] = qdd_temp[0];
      QDDot[q_index + 1] = qdd_temp[1];
      QDDot[q_index + 2] = qdd_temp[2];
      model.a[i] = model.a[i] + model.multdof3_S[i] * qdd_temp;
    } else if (model.mJoints[i].mDoFCount == 1
               && model.mJoints[i].mJointType != JointTypeCustom) {
      QDDot[q_index] = (1./model.d[i]) * (
                         model.u[i] - model.U[i].dot(model.a[i]));
      model.a[i] = model.a[i] + model.S[i] * QDDot[q_index];
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      VectorNd qdd_temp = VectorNd::Zero(dofI);

      qdd_temp = model.mCustomJoints[kI]->Dinv
                 * (model.mCustomJoints[kI]->u
                    - model.mCustomJoints[kI]->U.transpose()
                    * model.a[i]);

      for(int z=0; z<dofI; ++z) {
        QDDot[q_index+z] = qdd_temp[z];
      }

      model.a[i] = model.a[i] + (model.mCustomJoints[kI]->S * qdd_temp);
    }
  }

  LOG << "QDDot = " << QDDot.transpose() << std::endl;
}

//==============================================================================
/** @brief Computes the effect of external forces on the generalized
            accelerations.

    This function is essentially similar to ForwardDynamics() except that it
    tries to only perform computations of variables that change due to
    external forces defined in f_t.
 */
RBDL_DLLAPI
void ForwardDynamicsAccelerationDeltas (
  Model &model,
  ConstraintSet &CS,
  VectorNd &QDDot_t,
  const unsigned int body_id,
  const std::vector<SpatialVector> &f_t
)
{
  LOG << "-------- " << __func__ << " ------" << std::endl;

  assert (CS.d_pA.size() == model.mBodies.size());
  assert (CS.d_a.size() == model.mBodies.size());
  assert (CS.d_u.size() == model.mBodies.size());

  // TODO reset all values (debug)
  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    CS.d_pA[i].setZero();
    CS.d_a[i].setZero();
    CS.d_u[i] = 0.;
    CS.d_multdof3_u[i].setZero();
  }
  for(unsigned int i=0; i<model.mCustomJoints.size(); i++) {
    model.mCustomJoints[i]->d_u.setZero();
  }

  for (unsigned int i = body_id; i > 0; i--) {
    if (i == body_id) {
      CS.d_pA[i] = -model.X_base[i].applyAdjoint(f_t[i]);
    }

    if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      CS.d_multdof3_u[i] = - model.multdof3_S[i].transpose() * (CS.d_pA[i]);

      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        CS.d_pA[lambda] =   CS.d_pA[lambda]
                            + model.X_lambda[i].applyTranspose (
                              CS.d_pA[i] + (model.multdof3_U[i]
                                            * model.multdof3_Dinv[i]
                                            * CS.d_multdof3_u[i]));
      }
    } else if(model.mJoints[i].mDoFCount == 1
              && model.mJoints[i].mJointType != JointTypeCustom) {
      CS.d_u[i] = - model.S[i].dot(CS.d_pA[i]);
      unsigned int lambda = model.lambda[i];

      if (lambda != 0) {
        CS.d_pA[lambda] = CS.d_pA[lambda]
                          + model.X_lambda[i].applyTranspose (
                            CS.d_pA[i] + model.U[i] * CS.d_u[i] / model.d[i]);
      }
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {

      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      //CS.
      model.mCustomJoints[kI]->d_u =
        - model.mCustomJoints[kI]->S.transpose() * (CS.d_pA[i]);
      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        CS.d_pA[lambda] =
          CS.d_pA[lambda]
          + model.X_lambda[i].applyTranspose (
            CS.d_pA[i] + (   model.mCustomJoints[kI]->U
                             * model.mCustomJoints[kI]->Dinv
                             * model.mCustomJoints[kI]->d_u)
          );
      }
    }
  }

  for (unsigned int i = 0; i < f_t.size(); i++) {
    LOG << "f_t[" << i << "] = " << f_t[i].transpose() << std::endl;
  }

  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    LOG << "i = " << i << ": d_pA[i] " << CS.d_pA[i].transpose() << std::endl;
  }
  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    LOG << "i = " << i << ": d_u[i] = " << CS.d_u[i] << std::endl;
  }

  QDDot_t[0] = 0.;
  CS.d_a[0] = model.a[0];

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    unsigned int q_index = model.mJoints[i].q_index;
    unsigned int lambda = model.lambda[i];

    SpatialVector Xa = model.X_lambda[i].apply(CS.d_a[lambda]);

    if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      Vector3d qdd_temp = model.multdof3_Dinv[i]
                          * (CS.d_multdof3_u[i] - model.multdof3_U[i].transpose() * Xa);

      QDDot_t[q_index] = qdd_temp[0];
      QDDot_t[q_index + 1] = qdd_temp[1];
      QDDot_t[q_index + 2] = qdd_temp[2];
      model.a[i] = model.a[i] + model.multdof3_S[i] * qdd_temp;
      CS.d_a[i] = Xa + model.multdof3_S[i] * qdd_temp;
    } else if (model.mJoints[i].mDoFCount == 1
               && model.mJoints[i].mJointType != JointTypeCustom) {

      QDDot_t[q_index] = (CS.d_u[i] - model.U[i].dot(Xa) ) / model.d[i];
      CS.d_a[i] = Xa + model.S[i] * QDDot_t[q_index];
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      VectorNd qdd_temp = VectorNd::Zero(dofI);

      qdd_temp = model.mCustomJoints[kI]->Dinv
                 * (model.mCustomJoints[kI]->d_u
                    - model.mCustomJoints[kI]->U.transpose() * Xa);

      for(int z=0; z<dofI; ++z) {
        QDDot_t[q_index+z] = qdd_temp[z];
      }

      model.a[i] = model.a[i] + model.mCustomJoints[kI]->S * qdd_temp;
      CS.d_a[i] = Xa + model.mCustomJoints[kI]->S * qdd_temp;
    }

    LOG << "QDDot_t[" << i - 1 << "] = " << QDDot_t[i - 1] << std::endl;
    LOG << "d_a[i] = " << CS.d_a[i].transpose() << std::endl;
  }
}

inline void set_zero (std::vector<SpatialVector> &spatial_values)
{
  for (unsigned int i = 0; i < spatial_values.size(); i++) {
    spatial_values[i].setZero();
  }
}

//==============================================================================
RBDL_DLLAPI
void ForwardDynamicsContactsKokkevis (
  Model &model,
  const VectorNd &Q,
  const VectorNd &QDot,
  const VectorNd &Tau,
  ConstraintSet &CS,
  VectorNd &QDDot
)
{
  LOG << "-------- " << __func__ << " ------" << std::endl;

  assert (CS.f_ext_constraints.size() == model.mBodies.size());
  assert (CS.QDDot_0.size() == model.dof_count);
  assert (CS.QDDot_t.size() == model.dof_count);
  assert (CS.f_t.size() == CS.size());
  assert (CS.point_accel_0.size() == CS.size());
  assert (CS.K.rows() == CS.size());
  assert (CS.K.cols() == CS.size());
  assert (CS.force.size() == CS.size());
  assert (CS.a.size() == CS.size());

  if(CS.constraints.size() != CS.contactConstraints.size()) {
    std::stringstream errormsg;
    errormsg << "Incompatible constraint types: all constraints"
             << " must be ContactConstraints for the Kokkevis method"
             << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  Vector3d point_accel_t;

  unsigned int ci = 0; //constraint index:
  // the row index in the constraint Jacobian.

  // The default acceleration only needs to be computed once
  {
    SUPPRESS_LOGGING;
    ForwardDynamics(model, Q, QDot, Tau, CS.QDDot_0);
  }

  LOG << "=== Initial Loop Start ===" << std::endl;
  // we have to compute the standard accelerations first as we use them to
  // compute the effects of each test force
  unsigned int bi = 0;
  for(bi =0; bi < CS.contactConstraints.size(); ++bi) {
    {
      SUPPRESS_LOGGING;
      UpdateKinematicsCustom(model, NULL, NULL, &CS.QDDot_0);
    }
    {
      LOG << "body_id = "
          << CS.contactConstraints[bi]->getBodyIds()[0]
          << std::endl;
      LOG << "point = "
          << CS.contactConstraints[bi]->getBodyFrames()[0].r
          << std::endl;
      LOG << "QDDot_0 = " << CS.QDDot_0.transpose() << std::endl;
    }
    {
      SUPPRESS_LOGGING;
      CS.contactConstraints[bi]->calcPointAccelerations(
        model,Q,QDot,CS.QDDot_0,CS.point_accel_0,false);
      CS.contactConstraints[bi]->calcPointAccelerationError(
        CS.point_accel_0,CS.a);
    }
  }

  // K: ContactConstraints
  unsigned int cj=0;
  unsigned int movable_body_id = 0;
  Vector3d point_global;

  for (bi = 0; bi < CS.contactConstraints.size(); bi++) {

    LOG << "=== Testforce Loop Start ===" << std::endl;

    ci = CS.contactConstraints[bi]->getConstraintIndex();

    movable_body_id = GetMovableBodyId(model,
                                       CS.contactConstraints[bi]->getBodyIds()[0]);

    // assemble the test force
    LOG << "point_global = " << point_global.transpose() << std::endl;

    CS.contactConstraints[bi]->calcPointForceJacobian(
      model,Q,CS.cache,CS.f_t,false);

    for(unsigned int j = 0; j<CS.contactConstraints[bi]
        ->getConstraintNormalVectors().size(); ++j) {

      CS.f_ext_constraints[movable_body_id] = CS.f_t[ci+j];

      LOG << "f_t[" << movable_body_id << "] = " << CS.f_t[ci+j].transpose()
          << std::endl;
      {
        ForwardDynamicsAccelerationDeltas(model, CS, CS.QDDot_t
                                          , movable_body_id, CS.f_ext_constraints);

        LOG << "QDDot_0 = " << CS.QDDot_0.transpose() << std::endl;
        LOG << "QDDot_t = " << (CS.QDDot_t + CS.QDDot_0).transpose()
            << std::endl;
        LOG << "QDDot_t - QDDot_0 = " << (CS.QDDot_t).transpose() << std::endl;
      }

      CS.f_ext_constraints[movable_body_id].setZero();

      CS.QDDot_t += CS.QDDot_0;
      // compute the resulting acceleration
      {
        SUPPRESS_LOGGING;
        UpdateKinematicsCustom(model, NULL, NULL, &CS.QDDot_t);
      }

      for(unsigned int dj = 0;
          dj < CS.contactConstraints.size(); dj++) {

        cj = CS.contactConstraints[dj]->getConstraintIndex();
        {
          SUPPRESS_LOGGING;
          CS.contactConstraints[dj]->calcPointAccelerations(
            model,Q,QDot,CS.QDDot_t,point_accel_t,false);
        }

        LOG << "point_accel_0  = " << CS.point_accel_0[ci+j].transpose()
            << std::endl;
        LOG << "point_accel_t = " << point_accel_t.transpose() << std::endl;
        for(unsigned int k=0;
            k < CS.contactConstraints[dj]
            ->getConstraintNormalVectors().size(); ++k) {

          CS.K(ci+j,cj+k) = CS.contactConstraints[dj]
                            ->getConstraintNormalVectors()[k].dot(
                              point_accel_t - CS.point_accel_0[cj+k]);
        }
      }
    }
  }




  LOG << "K = " << std::endl << CS.K << std::endl;
  LOG << "a = " << std::endl << CS.a << std::endl;

#ifdef RBDL_USE_CASADI_MATH
    auto linsol = casadi::Linsol("linear_solver", "symbolicqr", CS.K.sparsity());
    CS.force = linsol.solve(CS.K, CS.a);
#else
  switch (CS.linear_solver) {
  case (LinearSolverPartialPivLU) :
    CS.force = CS.K.partialPivLu().solve(CS.a);
    break;
  case (LinearSolverColPivHouseholderQR) :
    CS.force = CS.K.colPivHouseholderQr().solve(CS.a);
    break;
  case (LinearSolverHouseholderQR) :
    CS.force = CS.K.householderQr().solve(CS.a);
    break;
  default:
    LOG << "Error: Invalid linear solver: " << CS.linear_solver << std::endl;
    assert (0);
    break;
  }
#endif

  LOG << "f = " << CS.force.transpose() << std::endl;


  for(bi=0; bi<CS.contactConstraints.size(); ++bi) {
    unsigned int body_id =
      CS.contactConstraints[bi]->getBodyIds()[0];
    unsigned int movable_body_id = body_id;

    if (model.IsFixedBodyId(body_id)) {
      unsigned int fbody_id = body_id - model.fixed_body_discriminator;
      movable_body_id = model.mFixedBodies[fbody_id].mMovableParent;
    }
    ci = CS.contactConstraints[bi]->getConstraintIndex();

    for(unsigned int k=0;
        k<CS.contactConstraints[bi]->getConstraintSize(); ++k) {
      CS.f_ext_constraints[movable_body_id] -= CS.f_t[ci+k] * CS.force[ci+k];
      LOG << "f_ext[" << movable_body_id << "] = "
          << CS.f_ext_constraints[movable_body_id].transpose() << std::endl;
    }

  }



  {
    SUPPRESS_LOGGING;
    ForwardDynamicsApplyConstraintForces (model, Tau, CS, QDDot);
  }

  LOG << "QDDot after applying f_ext: " << QDDot.transpose() << std::endl;
}


//==============================================================================
#ifndef RBDL_USE_CASADI_MATH
RBDL_DLLAPI
bool isConstrainedSystemFullyActuated(
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  ConstraintSet &CS,
  std::vector<Math::SpatialVector> *f_ext)
{

  LOG << "-------- " << __func__ << " ------" << std::endl;


  assert (CS.S.cols()    == QDot.rows());

  unsigned int n  = unsigned(    CS.H.rows());
  unsigned int nc = unsigned( CS.name.size());
  unsigned int na = unsigned(    CS.S.rows());
  unsigned int nu = n-na;


  CalcConstrainedSystemVariables(model,Q,QDot,VectorNd::Zero(QDot.rows()),CS,
                                 f_ext);

  CS.GPT = CS.G*CS.P.transpose();

  CS.GPT_full_qr.compute(CS.GPT);
  unsigned int r = unsigned(CS.GPT_full_qr.rank());

  bool isCompatible = false;
  if(r == (n-na)) {
    isCompatible = true;
  } else {
    isCompatible = false;
  }

  return isCompatible;

}
#endif

RBDL_DLLAPI
void InverseDynamicsConstraints(
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  const Math::VectorNd &QDDotDesired,
  ConstraintSet &CS,
  Math::VectorNd &QDDotOutput,
  Math::VectorNd &TauOutput,
  std::vector<Math::SpatialVector> *f_ext)
{

  LOG << "-------- " << __func__ << " ------" << std::endl;

  assert (QDot.size()         == QDDotDesired.size());
  assert (QDDotDesired.size() == QDot.size());
  assert (QDDotOutput.size()  == QDot.size());
  assert (TauOutput.size()    == CS.H.rows());

  assert (CS.S.cols()     == QDDotDesired.rows());

  unsigned int n  = unsigned(    CS.H.rows());
  unsigned int nc = unsigned( CS.name.size());
  unsigned int na = unsigned(    CS.S.rows());
  unsigned int nu = n-na;

  TauOutput.setZero();
  CalcConstrainedSystemVariables(model,Q,QDot,TauOutput,CS,f_ext);

  // This implementation follows the projected KKT system described in
  // Eqn. 5.20 of Henning Koch's thesis work. Note that this will fail
  // for under actuated systems
  //  [ SMS'      SMP'    SJ'    I][      u]   [ -SC    ]
  //  [ PMS'      PMP'    PJ'     ][      v] = [ -PC    ]
  //  [ JS'        JP'     0      ][-lambda]   [ -gamma ]
  //  [ I                         ][   -tau]   [  v*     ]
  //double alpha = 0.1;

  CS.Ful = CS.S*CS.H*CS.S.transpose();
  CS.Fur = CS.S*CS.H*CS.P.transpose();
  CS.Fll = CS.P*CS.H*CS.S.transpose();
  CS.Flr = CS.P*CS.H*CS.P.transpose();

  CS.GTu = CS.S*(CS.G.transpose());
  CS.GTl = CS.P*(CS.G.transpose());

  //Exploiting the block triangular structure
  //u:
  //I u = S*qdd*
  CS.u = CS.S*QDDotDesired;
  // v
  //(JP')v = -gamma - (JS')u
  //Using GT

  //This fails using SimpleMath and I'm not sure how to fix it
  SolveLinearSystem( CS.GTl.transpose(),
                     CS.gamma - CS.GTu.transpose()*CS.u,
                     CS.v, CS.linear_solver);

  // lambda
  SolveLinearSystem(CS.GTl,
                    -CS.P*CS.C
                    - CS.Fll*CS.u
                    - CS.Flr*CS.v,
                    CS.force,
                    CS.linear_solver);

  for(unsigned int i=0; i<CS.force.rows(); ++i) {
    CS.force[i] *= -1.0;
  }

  //Evaluating qdd
  QDDotOutput = CS.S.transpose()*CS.u + CS.P.transpose()*CS.v;

  //Evaluating tau
  TauOutput = -CS.S.transpose()*( -CS.S*CS.C
                                  -( CS.Ful*CS.u
                                     +CS.Fur*CS.v
                                     -CS.GTu*CS.force));




}

#ifndef RBDL_USE_CASADI_MATH
RBDL_DLLAPI
void InverseDynamicsConstraintsRelaxed(
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  const Math::VectorNd &QDDotControls,
  ConstraintSet &CS,
  Math::VectorNd &QDDotOutput,
  Math::VectorNd &TauOutput,
  std::vector<Math::SpatialVector> *f_ext)
{
  LOG << "-------- " << __func__ << " --------" << std::endl;

  //Check that the input vectors and matricies are sized appropriately
  assert(Q.size()               == model.q_size);
  assert(QDot.size()            == model.qdot_size);
  assert(QDDotControls.size()    == model.dof_count);
  assert(CS.S.cols()            == model.dof_count);
  assert(CS.W.rows()            == CS.W.cols());
  assert(CS.W.rows()            == CS.S.rows());
  assert(QDDotOutput.size()     == model.dof_count);

  TauOutput.setZero();
  CalcConstrainedSystemVariables(model,Q,QDot,TauOutput,CS,f_ext);

  unsigned int n  = unsigned(    CS.H.rows());
  unsigned int nc = unsigned( CS.name.size());
  unsigned int na = unsigned(    CS.S.rows());
  unsigned int nu = n-na;

  //MM 2020/5/29:
  //  The updates I made to Henning's original formulation have
  //  almost certainly made the sensitivity of the resulting qdd
  //  w.r.t. the controls poorly scaled. At least this is a suspicion
  //  of mine looking at how an OCP is behaving when using this operator.
  //  Reverting to the original formulation.
  //MM: Update to Henning's formulation s.t. the relaxed IDC operator will
  //    more closely satisfy QDDotControls if it is possible.
  //double diag = 0.;//100.*CS.H.maxCoeff();
  //double diagInv = 0.;
  //for(unsigned int i=0; i<CS.H.rows(); ++i) {
  //  for(unsigned int j=0; j<CS.H.cols(); ++j) {
  //    if(fabs(CS.H(i,j)) > diag) {
  //      diag = fabs(CS.H(i,j));
  //    }
  //  }
  //}
  //diag = diag*100.;
  //diagInv = 1.0/diag;
  //for(unsigned int i=0; i<CS.W.rows(); ++i) {
  //  CS.W(i,i)    = diag;
  //  CS.Winv(i,i) = diagInv;
  //}

  CS.W = 100.0*CS.S*CS.H*CS.S.transpose();
  CS.Winv = CS.W.inverse();
  CS.WinvSC = CS.Winv * CS.S * CS.C;

  //CS.W = CS.S*CS.H*CS.S.transpose();

  CS.F.block(  0,  0, na, na) = CS.S*CS.H*CS.S.transpose() + CS.W;
  CS.F.block(  0, na, na, nu) = CS.S*CS.H*CS.P.transpose();
  CS.F.block( na,  0, nu, na) = CS.P*CS.H*CS.S.transpose();
  CS.F.block( na, na, nu, nu) = CS.P*CS.H*CS.P.transpose();

  CS.GT.block(  0, 0,na, nc) = CS.S*(CS.G.transpose());
  CS.GT.block( na, 0,nu, nc) = CS.P*(CS.G.transpose());

  CS.GT_qr.compute (CS.GT);
  CS.GT_qr.householderQ().evalTo (CS.GT_qr_Q);

  //GT = [Y  Z] * [ R ]
  //              [ 0 ]

  CS.R  = CS.GT_qr_Q.transpose()*CS.GT;
  CS.Ru = CS.R.block(0,0,nc,nc);

  CS.Y = CS.GT_qr_Q.block( 0, 0,  n, nc    );
  CS.Z = CS.GT_qr_Q.block( 0, nc, n, (n-nc));

  //MM: Update to Henning's formulation s.t. the relaxed IDC operator will
  //    exactly satisfy QDDotControls if it is possible.
  //
  //Modify QDDotControls so that SN is cancelled.
  //
  //    +SC - WS(qdd*)
  //
  // Add a term to cancel off SN
  //
  //    +SC - WS( qdd* + (S' W^-1 S)N )
  //

  CS.u = CS.S*CS.C - CS.W*(CS.S*(QDDotControls
                                 +(CS.S.transpose()*CS.WinvSC)));
  //CS.u =  CS.S*CS.C - CS.W*(CS.S*QDDotControls);
  CS.v =  CS.P*CS.C;

  for(unsigned int i=0; i<CS.S.rows(); ++i) {
    CS.g[i] = CS.u[i];
  }
  unsigned int j=CS.S.rows();
  for(unsigned int i=0; i<CS.P.rows(); ++i) {
    CS.g[j] = CS.v[i];
    ++j;
  }

  //nc x nc system
  SolveLinearSystem(CS.Ru.transpose(), CS.gamma, CS.py, CS.linear_solver);

  //(n-nc) x (n-nc) system
  SolveLinearSystem(CS.Z.transpose()*CS.F*CS.Z,
                    CS.Z.transpose()*(-CS.F*CS.Y*CS.py-CS.g),
                    CS.pz,
                    CS.linear_solver);

  //nc x nc system
  SolveLinearSystem(CS.Ru,
                    CS.Y.transpose()*(CS.g + CS.F*CS.Y*CS.py + CS.F*CS.Z*CS.pz),
                    CS.force, CS.linear_solver);

  //Eqn. 32d, the equation for qdd, is in error. Instead
  // p = Ypy + Zpz = [v,w]
  // qdd = S'v + P'w
  QDDotOutput = CS.Y*CS.py + CS.Z*CS.pz;
  for(unsigned int i=0; i<CS.S.rows(); ++i) {
    CS.u[i] = QDDotOutput[i];
  }
  j = CS.S.rows();
  for(unsigned int i=0; i<CS.P.rows(); ++i) {
    CS.v[i] = QDDotOutput[j];
    ++j;
  }

  QDDotOutput = CS.S.transpose()*CS.u
                +CS.P.transpose()*CS.v;

  TauOutput = (CS.S.transpose()*CS.W*CS.S)*(
                QDDotControls+(CS.S.transpose()*CS.WinvSC)
                -QDDotOutput);
  //TauOutput =  CS.S.transpose()*CS.W*CS.S*(QDDotControls - QDDotOutput);


}
#endif

void SolveLinearSystem (
  const MatrixNd& A,
  const VectorNd& b,
  VectorNd& x,
  LinearSolver ls
)
{
  if(A.rows() != b.size() || A.cols() != x.size()) {
    throw Errors::RBDLSizeMismatchError("Mismatching sizes.\n");
  }

#ifdef RBDL_USE_CASADI_MATH
  auto linsol = casadi::Linsol("linear_solver", "symbolicqr", A.sparsity());
  x = linsol.solve(A, b);
#else
  // Solve the system A*x = b.
  switch (ls) {
  case (LinearSolverPartialPivLU) :
    x = A.partialPivLu().solve(b);
    break;
  case (LinearSolverColPivHouseholderQR) :
    x = A.colPivHouseholderQr().solve(b);
    break;
  case (LinearSolverHouseholderQR) :
    x = A.householderQr().solve(b);
    break;
  default:
    std::ostringstream errormsg;
    errormsg << "Error: Invalid linear solver: " << ls << std::endl;
    throw Errors::RBDLError(errormsg.str());
    break;
  }
#endif
}

//==============================================================================
unsigned int GetMovableBodyId (Model& model, unsigned int id)
{
  if(model.IsFixedBodyId(id)) {
    unsigned int fbody_id = id - model.fixed_body_discriminator;
    return model.mFixedBodies[fbody_id].mMovableParent;
  } else {
    return id;
  }
}

//==============================================================================

void ConstraintSet::calcForces(
  unsigned int groupIndex,
  Model& model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  std::vector< unsigned int > &constraintBodyIdsUpd,
  std::vector< Math::SpatialTransform > &constraintBodyFramesUpd,
  std::vector< Math::SpatialVector > &constraintForcesUpd,
  bool resolveAllInRootFrame,
  bool updKin)
{
  assert(groupIndex <= unsigned(constraints.size()-1));

  if (updKin) {
    UpdateKinematicsCustom (model, &Q, &QDot, NULL);
  }

  constraints[groupIndex]->calcConstraintForces(model,0.,Q,QDot,G,force,
      constraintBodyIdsUpd,
      constraintBodyFramesUpd,
      constraintForcesUpd,
      cache,
      resolveAllInRootFrame,
      updKin);
}

//==============================================================================

void ConstraintSet::calcImpulses(
  unsigned int groupIndex,
  Model& model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  std::vector< unsigned int > &constraintBodyIdsUpd,
  std::vector< Math::SpatialTransform > &constraintBodyFramesUpd,
  std::vector< Math::SpatialVector > &constraintImpulsesUpd,
  bool resolveAllInRootFrame,
  bool updKin)
{
  assert(groupIndex <= unsigned(constraints.size()-1));

  if (updKin) {
    UpdateKinematicsCustom (model, &Q, &QDot, NULL);
  }

  //The transformation is identical to resolve the impulses
  //to the desired frame
  constraints[groupIndex]->calcConstraintForces(model,0.,Q,QDot,G,impulse,
      constraintBodyIdsUpd,
      constraintBodyFramesUpd,
      constraintImpulsesUpd,
      cache,
      resolveAllInRootFrame,
      updKin);

  //But due to Martin's choice of signs on the Lagrange multipliers vs
  //impulses the signs are opposite
  for(unsigned int i=0; i<constraintImpulsesUpd.size(); ++i) {
    constraintImpulsesUpd[i] *= -1.0;
  }
}

//==============================================================================

void ConstraintSet::calcPositionError(
  unsigned int groupIndex,
  Model& model,
  const Math::VectorNd &Q,
  Math::VectorNd &posErrUpd,
  bool updKin)
{
  assert(groupIndex <= unsigned(constraints.size()-1));

  if (updKin) {
    UpdateKinematicsCustom (model, &Q, NULL, NULL);
  }

  //Update the position errors for this constraint in the system level
  //error vector
  constraints[groupIndex]->calcPositionError(model,0.,Q,err,cache,updKin);

  //Pick out the position errors for this constraint from the system level
  //error vector.
  constraints[groupIndex]->getPositionError(err,posErrUpd);

}
//==============================================================================

void ConstraintSet::calcVelocityError(
  unsigned int groupIndex,
  Model& model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  Math::VectorNd &velErrUpd,
  bool updKin)
{
  assert(groupIndex <= unsigned(constraints.size()-1));

  if (updKin) {
    UpdateKinematicsCustom (model, &Q, &QDot, NULL);
  }

  //Update the constraint Jacobian of this constraint
  constraints[groupIndex]->calcConstraintJacobian(model,0.,Q,QDot,G,cache,
      updKin);

  //Update the velocity-level errors of this constraint
  constraints[groupIndex]->calcVelocityError(model,0.,Q,QDot,G,errd,cache,
      updKin);

  //Pick out the sub vector of velocity errors for this constraint from
  //the system error vector.
  constraints[groupIndex]->getVelocityError(errd,velErrUpd);

}
//==============================================================================

void ConstraintSet::calcBaumgarteStabilizationForces(
  unsigned int groupIndex,
  Model& model,
  const Math::VectorNd &positionError,
  const Math::VectorNd &velocityError,
  Math::VectorNd &baumgarteForces)
{
  assert(groupIndex <= unsigned(constraints.size()-1));
  assert(positionError.rows() == constraints[groupIndex]->getConstraintSize());
  assert(velocityError.rows() == constraints[groupIndex]->getConstraintSize());

  constraints[groupIndex]->getBaumgarteStabilizationForces(positionError,
      velocityError,
      baumgarteForces);

}

}